

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_packsize(lua_State *L)

{
  KOption KVar1;
  int local_38;
  KOption opt;
  int ntoalign;
  int size;
  size_t totalsize;
  char *fmt;
  Header h;
  lua_State *L_local;
  
  h._8_8_ = L;
  totalsize = (size_t)luaL_checklstring(L,1,(size_t *)0x0);
  _ntoalign = 0;
  initheader((lua_State *)h._8_8_,(Header *)&fmt);
  while (*(char *)totalsize != '\0') {
    KVar1 = getdetails((Header *)&fmt,_ntoalign,(char **)&totalsize,(int *)&opt,&local_38);
    if ((KVar1 == Kstring) || (KVar1 == Kzstr)) {
      luaL_argerror((lua_State *)h._8_8_,1,"variable-length format");
    }
    opt = local_38 + opt;
    if (0x7fffffffU - (long)(int)opt < _ntoalign) {
      luaL_argerror((lua_State *)h._8_8_,1,"format result too large");
    }
    _ntoalign = (long)(int)opt + _ntoalign;
  }
  lua_pushinteger((lua_State *)h._8_8_,_ntoalign);
  return 1;
}

Assistant:

static int str_packsize (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);  /* format string */
  size_t totalsize = 0;  /* accumulate total size of result */
  initheader(L, &h);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
    luaL_argcheck(L, opt != Kstring && opt != Kzstr, 1,
                     "variable-length format");
    size += ntoalign;  /* total space used by option */
    luaL_argcheck(L, totalsize <= MAXSIZE - size, 1,
                     "format result too large");
    totalsize += size;
  }
  lua_pushinteger(L, (lua_Integer)totalsize);
  return 1;
}